

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O0

int x509_rsa_pss_to_ctx(EVP_MD_CTX *ctx,X509_ALGOR *sigalg,EVP_PKEY *pkey)

{
  EVP_PKEY_CTX *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  EVP_PKEY_CTX *local_50;
  EVP_PKEY_CTX *pctx;
  uint64_t salt_len;
  EVP_MD *md;
  EVP_MD *mgf1md;
  RSA_PSS_PARAMS *pss;
  EVP_PKEY *pEStack_20;
  int ret;
  EVP_PKEY *pkey_local;
  X509_ALGOR *sigalg_local;
  EVP_MD_CTX *ctx_local;
  
  pEStack_20 = (EVP_PKEY *)pkey;
  pkey_local = (EVP_PKEY *)sigalg;
  sigalg_local = (X509_ALGOR *)ctx;
  iVar2 = OBJ_obj2nid((ASN1_OBJECT *)sigalg->algorithm);
  if (iVar2 != 0x390) {
    __assert_fail("OBJ_obj2nid(sigalg->algorithm) == NID_rsassaPss",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0xd9,"int x509_rsa_pss_to_ctx(EVP_MD_CTX *, const X509_ALGOR *, EVP_PKEY *)");
  }
  pss._4_4_ = 0;
  mgf1md = (EVP_MD *)rsa_pss_decode((X509_ALGOR *)pkey_local);
  if (mgf1md == (EVP_MD *)0x0) {
    ERR_put_error(0xb,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0xe1);
  }
  else {
    md = rsa_mgf1_to_md(*(X509_ALGOR **)&mgf1md->flags);
    salt_len = (uint64_t)rsa_algor_to_md(*(X509_ALGOR **)mgf1md);
    if ((md != (EVP_MD *)0x0) && ((EVP_MD *)salt_len != (EVP_MD *)0x0)) {
      if (md == (EVP_MD *)salt_len) {
        pctx = (EVP_PKEY_CTX *)0x0;
        if (((mgf1md->init == (_func_void_EVP_MD_CTX_ptr *)0x0) ||
            (iVar2 = ASN1_INTEGER_get_uint64((uint64_t *)&pctx,(ASN1_INTEGER *)mgf1md->init),
            pEVar1 = pctx, iVar2 == 0)) ||
           (iVar2 = EVP_MD_size((EVP_MD *)salt_len),
           pEVar1 != (EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar2))) {
          ERR_put_error(0xb,0,0x70,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                        ,0xf7);
        }
        else {
          if ((EVP_PKEY_CTX *)0x7fffffff < pctx) {
            __assert_fail("salt_len <= INT_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                          ,0xfa,
                          "int x509_rsa_pss_to_ctx(EVP_MD_CTX *, const X509_ALGOR *, EVP_PKEY *)");
          }
          if ((mgf1md->update == (_func_void_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0) ||
             (lVar3 = ASN1_INTEGER_get((ASN1_INTEGER *)mgf1md->update), lVar3 == 1)) {
            iVar2 = EVP_DigestVerifyInit
                              ((EVP_MD_CTX *)sigalg_local,(EVP_PKEY_CTX **)&local_50,
                               (EVP_MD *)salt_len,(ENGINE *)0x0,pEStack_20);
            if (((iVar2 != 0) && (iVar2 = EVP_PKEY_CTX_set_rsa_padding(local_50,6), iVar2 != 0)) &&
               ((iVar2 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_50,(int)pctx), iVar2 != 0 &&
                (iVar2 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_50,md), iVar2 != 0)))) {
              pss._4_4_ = 1;
            }
          }
          else {
            ERR_put_error(0xb,0,0x70,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                          ,0x101);
          }
        }
      }
      else {
        ERR_put_error(0xb,0,0x70,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                      ,0xed);
      }
    }
  }
  RSA_PSS_PARAMS_free((RSA_PSS_PARAMS *)mgf1md);
  return pss._4_4_;
}

Assistant:

int x509_rsa_pss_to_ctx(EVP_MD_CTX *ctx, const X509_ALGOR *sigalg,
                        EVP_PKEY *pkey) {
  assert(OBJ_obj2nid(sigalg->algorithm) == NID_rsassaPss);

  // Decode PSS parameters
  int ret = 0;
  RSA_PSS_PARAMS *pss = rsa_pss_decode(sigalg);

  {
    if (pss == NULL) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
      goto err;
    }

    const EVP_MD *mgf1md = rsa_mgf1_to_md(pss->maskGenAlgorithm);
    const EVP_MD *md = rsa_algor_to_md(pss->hashAlgorithm);
    if (mgf1md == NULL || md == NULL) {
      goto err;
    }

    // We require the MGF-1 and signing hashes to match.
    if (mgf1md != md) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
      goto err;
    }

    // We require the salt length be the hash length. The DEFAULT value is 20,
    // but this does not match any supported salt length.
    uint64_t salt_len = 0;
    if (pss->saltLength == NULL ||
        !ASN1_INTEGER_get_uint64(&salt_len, pss->saltLength) ||
        salt_len != EVP_MD_size(md)) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
      goto err;
    }
    assert(salt_len <= INT_MAX);

    // The trailer field must be 1 (0xbc). This value is DEFAULT, so the
    // structure is required to omit it in DER. Although a syntax error, we also
    // tolerate an explicitly-encoded value. See the certificates in
    // cl/362617931.
    if (pss->trailerField != NULL && ASN1_INTEGER_get(pss->trailerField) != 1) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
      goto err;
    }

    EVP_PKEY_CTX *pctx;
    if (!EVP_DigestVerifyInit(ctx, &pctx, md, NULL, pkey) ||
        !EVP_PKEY_CTX_set_rsa_padding(pctx, RSA_PKCS1_PSS_PADDING) ||
        !EVP_PKEY_CTX_set_rsa_pss_saltlen(pctx, (int)salt_len) ||
        !EVP_PKEY_CTX_set_rsa_mgf1_md(pctx, mgf1md)) {
      goto err;
    }

    ret = 1;
  }

err:
  RSA_PSS_PARAMS_free(pss);
  return ret;
}